

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_canvas.c
# Opt level: O0

void glob_open(t_pd *ignore,t_symbol *name,t_symbol *dir,t_floatarg f)

{
  t_pd *pp_Var1;
  _glist *local_30;
  _glist *gl;
  t_floatarg f_local;
  t_symbol *dir_local;
  t_symbol *name_local;
  t_pd *ignore_local;
  
  if ((f != 0.0) || (NAN(f))) {
    for (local_30 = pd_getcanvaslist(); local_30 != (_glist *)0x0; local_30 = local_30->gl_next) {
      if (((name == local_30->gl_name) && (local_30->gl_env != (_canvasenvironment *)0x0)) &&
         (local_30->gl_env->ce_dir == dir)) {
        canvas_vis(local_30,1.0);
        return;
      }
    }
  }
  pp_Var1 = glob_evalfile(ignore,name,dir);
  if (pp_Var1 == (t_pd *)0x0) {
    pdgui_vmess("::pdwindow::busyrelease",(char *)0x0);
  }
  return;
}

Assistant:

void glob_open(t_pd *ignore, t_symbol *name, t_symbol *dir, t_floatarg f)
{
    t_glist *gl;
    if (f != 0)
        for (gl = pd_getcanvaslist(); gl; gl = gl->gl_next)
            if (name == gl->gl_name && gl->gl_env && gl->gl_env->ce_dir == dir)
    {
            /* don't reopen already-open document, just vis it */
        canvas_vis(gl, 1);
        return;
    }
    if (!glob_evalfile(ignore, name, dir))
        pdgui_vmess("::pdwindow::busyrelease", 0);
}